

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  undefined1 *puVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  Ch *pCVar3;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *pBVar4;
  Ch CVar5;
  bool bVar6;
  undefined1 uVar7;
  byte in_CL;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_RSI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  bool bVar8;
  Ch *str;
  SizeType length;
  StackStream<char> stackStream;
  bool success;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *s;
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  copy;
  size_t offset;
  uint codepoint2;
  uint codepoint;
  Ch e;
  size_t escapeOffset;
  Ch c;
  char *ret;
  char *ret_1;
  char *ret_2;
  undefined4 in_stack_fffffffffffffdb8;
  ParseErrorCode in_stack_fffffffffffffdbc;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffdc8
  ;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffdd0
  ;
  undefined7 in_stack_fffffffffffffdd8;
  Ch in_stack_fffffffffffffddf;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffdf0
  ;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  bool local_1eb;
  bool local_1e9;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> local_1a8;
  size_t local_160;
  uint local_154;
  uint local_150;
  byte local_149;
  size_t local_148;
  byte local_139;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *local_138;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *local_130;
  char local_119;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *local_118;
  undefined1 local_10a;
  char local_109;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffef8
  ;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  
  local_1a8.current_._7_1_ = in_CL & 1;
  internal::
  StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
  ::StreamLocalCopy((StreamLocalCopy<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_0>
                     *)&local_1a8.bufferLast_,in_RSI);
  local_1a8.bufferSize_ = (size_t)local_1a8.bufferLast_;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
            ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  local_1a8.buffer_._7_1_ = 0;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  StackStream<char>::StackStream((StackStream<char> *)&local_1a8,in_RDI);
  local_130 = (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
              local_1a8.bufferSize_;
  local_138 = &local_1a8;
  do {
    while( true ) {
      while( true ) {
        while (local_139 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
                           Peek(local_130), local_139 == 0x5c) {
          local_148 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell
                                (local_130);
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                    ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
          local_149 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Peek
                                (local_130);
          if (ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::BasicIStreamWrapper<std::istream>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
              ::escape[local_149] == '\0') {
            if (local_149 == 0x75) {
              BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                        ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                         CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
              local_150 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>
                                    ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                      *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8
                                                ),in_stack_fffffffffffffdd0,
                                     (size_t)in_stack_fffffffffffffdc8);
              bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                       *)0x3b38bc);
              if (bVar6) goto LAB_003b3eda;
              local_1e9 = 0xd7ff < local_150 && local_150 < 0xe000;
              if (local_1e9) {
                if (local_150 < 0xdc00) {
                  local_109 = '\\';
                  in_stack_fffffffffffffef8 = local_130;
                  CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
                          Peek(local_130);
                  in_stack_ffffffffffffff07 = CVar5 == local_109;
                  if ((bool)in_stack_ffffffffffffff07) {
                    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                              ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
                  }
                  bVar6 = true;
                  if ((bool)in_stack_ffffffffffffff07) {
                    local_118 = local_130;
                    local_119 = 'u';
                    CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>
                            ::Peek(local_130);
                    bVar8 = CVar5 == local_119;
                    if (bVar8) {
                      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
                    }
                    bVar6 = !bVar8;
                    local_10a = bVar8;
                  }
                  if (bVar6) {
                    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                                    ,in_stack_fffffffffffffdbc,0x3b3a07);
                    bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                             *)0x3b3a14);
                    if (bVar6) goto LAB_003b3eda;
                  }
                  local_154 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>
                                        ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                          *)CONCAT17(in_stack_fffffffffffffddf,
                                                     in_stack_fffffffffffffdd8),
                                         in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8
                                        );
                  bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)0x3b3a52);
                  if (bVar6) goto LAB_003b3eda;
                  local_1eb = local_154 < 0xdc00 || 0xdfff < local_154;
                  if (local_1eb) {
                    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                    ::SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                     *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                                    ,in_stack_fffffffffffffdbc,0x3b3aa6);
                    bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                             *)0x3b3ab3);
                    if (bVar6) goto LAB_003b3eda;
                  }
                  local_150 = ((local_150 - 0xd800) * 0x400 | local_154 - 0xdc00) + 0x10000;
                }
                else {
                  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                                  in_stack_fffffffffffffdbc,0x3b3b06);
                  bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)0x3b3b13);
                  if (bVar6) goto LAB_003b3eda;
                }
              }
              UTF8<char>::
              Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                        ((StackStream<char> *)
                         CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                         (uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            }
            else {
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                            in_stack_fffffffffffffdbc,0x3b3b52);
              bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                       *)0x3b3b5f);
              if (bVar6) goto LAB_003b3eda;
            }
          }
          else {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                      ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                       CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
            pBVar4 = local_138;
            uVar7 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::BasicIStreamWrapper<std::istream>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
                    ::escape[local_149];
            pbVar2 = local_138->stream_;
            if (*(long *)&pbVar2->field_0x20 - *(long *)&pbVar2->field_0x18 < 1) {
              internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                        ((Stack<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdd0,
                         (size_t)in_stack_fffffffffffffdc8);
            }
            puVar1 = *(undefined1 **)&pbVar2->field_0x18;
            *(long *)&pbVar2->field_0x18 = *(long *)&pbVar2->field_0x18 + 1;
            *puVar1 = uVar7;
            *(int *)pBVar4->peekBuffer_ = *(int *)pBVar4->peekBuffer_ + 1;
          }
        }
        if (local_139 == 0x22) {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                    ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
          in_stack_fffffffffffffdff = 0;
          in_stack_fffffffffffffe00 = local_138->stream_;
          in_stack_fffffffffffffdf0 = local_138;
          if (*(long *)&in_stack_fffffffffffffe00->field_0x20 -
              *(long *)&in_stack_fffffffffffffe00->field_0x18 < 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                      ((Stack<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdd0,
                       (size_t)in_stack_fffffffffffffdc8);
          }
          puVar1 = *(undefined1 **)&in_stack_fffffffffffffe00->field_0x18;
          *(long *)&in_stack_fffffffffffffe00->field_0x18 =
               *(long *)&in_stack_fffffffffffffe00->field_0x18 + 1;
          *puVar1 = in_stack_fffffffffffffdff;
          *(int *)in_stack_fffffffffffffdf0->peekBuffer_ =
               *(int *)in_stack_fffffffffffffdf0->peekBuffer_ + 1;
          goto LAB_003b3eda;
        }
        if (local_139 < 0x20) break;
        local_160 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell
                              (local_130);
        in_stack_fffffffffffffdc8 = local_138;
        in_stack_fffffffffffffddf =
             BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take
                       ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                        CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
        pbVar2 = in_stack_fffffffffffffdc8->stream_;
        in_stack_fffffffffffffdd0 = in_stack_fffffffffffffdc8;
        if (*(long *)&pbVar2->field_0x20 - *(long *)&pbVar2->field_0x18 < 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>
                    ((Stack<rapidjson::CrtAllocator> *)in_stack_fffffffffffffdc8,
                     (size_t)in_stack_fffffffffffffdc8);
        }
        pCVar3 = *(Ch **)&pbVar2->field_0x18;
        *(long *)&pbVar2->field_0x18 = *(long *)&pbVar2->field_0x18 + 1;
        *pCVar3 = in_stack_fffffffffffffddf;
        *(int *)in_stack_fffffffffffffdd0->peekBuffer_ =
             *(int *)in_stack_fffffffffffffdd0->peekBuffer_ + 1;
      }
      if (local_139 != 0) break;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(local_130);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                    in_stack_fffffffffffffdbc,0x3b3ce9);
      bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x3b3cf6);
      if (bVar6) goto LAB_003b3eda;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell(local_130);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                  in_stack_fffffffffffffdbc,0x3b3d25);
    bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x3b3d32);
  } while (!bVar6);
LAB_003b3eda:
  bVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x3b3ee9);
  if (!bVar6) {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    StackStream<char>::Length((StackStream<char> *)&local_1a8);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    StackStream<char>::Pop((StackStream<char> *)0x3b3f1e);
    if ((local_1a8.current_._7_1_ & 1) == 0) {
      uVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::String((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)in_stack_fffffffffffffe00,
                       (Ch *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                       (SizeType)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffffdf0 >> 0x18,0));
    }
    else {
      uVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Key((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                    (Ch *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),0,false);
    }
    if (((uVar7 ^ 0xff) & 1) != 0) {
      local_1a8.buffer_._7_1_ = uVar7;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Tell
                ((BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *)
                 local_1a8.bufferSize_);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(uVar7,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdbc,0x3b3fc2)
      ;
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)0x3b3fd1);
    }
  }
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }